

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  string local_80;
  uchar local_59;
  ulong uStack_58;
  uchar byte;
  size_t j;
  size_t bytes;
  ulong local_38;
  size_t i;
  size_t inputIndex;
  uchar *local_20;
  uchar *input_local;
  cmUuid *this_local;
  string *output;
  
  inputIndex._7_1_ = 0;
  local_20 = input;
  input_local = (uchar *)this;
  this_local = (cmUuid *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  i = 0;
  for (local_38 = 0; uVar1 = local_38,
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->Groups), uVar1 < sVar2;
      local_38 = local_38 + 1) {
    if (local_38 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'-');
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->Groups,local_38);
    j = (size_t)*pvVar3;
    for (uStack_58 = 0; uStack_58 < j; uStack_58 = uStack_58 + 1) {
      local_59 = local_20[i];
      i = i + 1;
      ByteToHex_abi_cxx11_(&local_80,this,local_59);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < this->Groups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = this->Groups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}